

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer *__return_storage_ptr__;
  istream *piVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type __n;
  ulong uVar4;
  int i;
  long lVar5;
  undefined1 local_80 [8];
  field_t field;
  string ROW;
  pos_t pos;
  int KR;
  int KC;
  bool back;
  bool explore;
  
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&R);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&C);
  std::istream::operator>>(piVar1,&A);
  std::istream::ignore();
  __n = (size_type)R;
  ROW.field_2._12_4_ = 0x3f;
  std::vector<ECell,_std::allocator<ECell>_>::vector
            ((vector<ECell,_std::allocator<ECell>_> *)
             &field.
              super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)C,
             (value_type *)(ROW.field_2._M_local_buf + 0xc),(allocator_type *)&pos);
  std::
  vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
  ::vector((vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
            *)local_80,__n,
           (value_type *)
           &field.
            super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,(allocator_type *)&pos.second);
  __return_storage_ptr__ =
       &field.
        super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::_Vector_base<ECell,_std::allocator<ECell>_>::~_Vector_base
            ((_Vector_base<ECell,_std::allocator<ECell>_> *)__return_storage_ptr__);
  KR._2_1_ = 0;
  do {
    piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&pos.first);
    std::istream::operator>>(piVar1,&pos.second);
    std::istream::ignore();
    ROW.field_2._12_4_ = pos.first;
    for (lVar5 = 0; lVar5 < R; lVar5 = lVar5 + 1) {
      field.
      super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&ROW._M_string_length;
      ROW._M_dataplus._M_p = (pointer)0x0;
      ROW._M_string_length._0_1_ = 0;
      std::operator>>((istream *)&std::cin,(string *)__return_storage_ptr__);
      std::istream::ignore();
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__return_storage_ptr__);
      std::endl<char,std::char_traits<char>>(poVar2);
      uVar3 = (ulong)(uint)C;
      if (C < 1) {
        uVar3 = 0;
      }
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        (((pointer)((long)local_80 + lVar5 * 0x18))->
        super__Vector_base<ECell,_std::allocator<ECell>_>)._M_impl.super__Vector_impl_data._M_start
        [uVar4] = (int)*(char *)((long)&((field.
                                          super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super__Vector_base<ECell,_std::allocator<ECell>_>)._M_impl.
                                        super__Vector_impl_data._M_start + uVar4);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    KR._3_1_ = 1;
    step_abi_cxx11_((string *)__return_storage_ptr__,(field_t *)local_80,
                    (pos_t *)((long)&ROW.field_2 + 0xc),(bool *)((long)&KR + 2),
                    (bool *)((long)&KR + 3));
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)__return_storage_ptr__);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  } while( true );
}

Assistant:

int main()
{
    std::cin >> R >> C >> A;
    std::cin.ignore();

    pos_t start(-1, -1);
    bool first_step = true;
    
    field_t field(R, row_t(C, EC_UNKNOWN));
    bool back = false;
    // game loop
    while (1)
    {
        int KR; // row where Kirk is located.
        int KC; // column where Kirk is located.
        std::cin >> KR >> KC;
        std::cin.ignore();
        
        pos_t pos(KR, KC);
        pos_t end;

        for (int i = 0; i < R; i++)
        {
            std::string ROW; // C of the characters in '#.TC?' (i.e. one line of the ASCII maze).
            std::cin >> ROW;
            std::cin.ignore();
            
            std::cerr << ROW << std::endl;
            for (int j = 0; j < C; j++)
            {
                field[i][j] = static_cast<ECell>(ROW[j]);
                if (EC_START == ROW[j])
                {
                    if (first_step)
                    {
                        start = pos;
                        first_step = false;
                    }
                }
            }
        }
        
        bool explore = true;
        std::cout << step(field, pos, back, explore) << std::endl;
    }
}